

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

int duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<long,int>
              (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  uint uVar1;
  string sStack_48;
  
  if ((int)input != input) {
    CastExceptionText<long,int>(&sStack_48,(duckdb *)input,idx);
    uVar1 = HandleVectorCastError::Operation<int>(&sStack_48,mask,idx,(VectorTryCastData *)dataptr);
    input = (long)uVar1;
    ::std::__cxx11::string::~string((string *)&sStack_48);
  }
  return (int)input;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}